

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

void __thiscall duckdb::LineReader::FillBuffer(LineReader *this)

{
  size_t sVar1;
  
  if ((this->end_of_file == false) && ((FILE *)this->fp != (FILE *)0x0)) {
    sVar1 = fread(this->data_buffer,1,0x64000,(FILE *)this->fp);
    this->position = 0;
    this->capacity = sVar1;
    this->total_read = this->total_read + sVar1;
    this->data_buffer[sVar1] = '\0';
    if (sVar1 == 0) {
      this->end_of_file = true;
    }
    if (0x63fffff < this->total_read) {
      fprintf(_stderr,
              "History file \"%s\" exceeds maximum history file size of %d MB - skipping full load\n"
              ,this->filename,100);
      this->capacity = 0;
      this->end_of_file = true;
    }
  }
  return;
}

Assistant:

void FillBuffer() {
		if (end_of_file || !fp) {
			return;
		}
		size_t read_data = fread(data_buffer, 1, LINE_BUFFER_SIZE, fp);
		position = 0;
		capacity = read_data;
		total_read += read_data;
		data_buffer[read_data] = '\0';

		if (read_data == 0) {
			end_of_file = true;
		}
		if (total_read >= LINENOISE_MAX_HISTORY) {
			fprintf(stderr, "History file \"%s\" exceeds maximum history file size of %d MB - skipping full load\n",
			        filename, LINENOISE_MAX_HISTORY / 1024 / 1024);
			capacity = 0;
			end_of_file = true;
		}
	}